

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

Instr * __thiscall Peeps::PeepRedundant(Peeps *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  RegNum RVar4;
  bool bVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  IntConstOpnd *pIVar8;
  long lVar9;
  RegOpnd *this_00;
  JITTimeFunctionBody *this_01;
  Instr *nopInstr;
  bool found;
  Instr *pIStack_28;
  RegNum edx;
  Instr *retInstr;
  Instr *instr_local;
  Peeps *this_local;
  
  if (((instr->m_opcode == ADD) || (instr->m_opcode == SUB)) || (instr->m_opcode == OR)) {
    pOVar6 = IR::Instr::GetSrc1(instr);
    if ((pOVar6 == (Opnd *)0x0) || (pOVar6 = IR::Instr::GetSrc2(instr), pOVar6 == (Opnd *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,1099,"(instr->GetSrc1() && instr->GetSrc2())",
                         "instr->GetSrc1() && instr->GetSrc2()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    pOVar6 = IR::Instr::GetSrc2(instr);
    bVar3 = IR::Opnd::IsIntConstOpnd(pOVar6);
    if (bVar3) {
      pOVar6 = IR::Instr::GetSrc2(instr);
      pIVar8 = IR::Opnd::AsIntConstOpnd(pOVar6);
      lVar9 = IR::EncodableOpnd<long>::GetValue(&pIVar8->super_EncodableOpnd<long>);
      if (lVar9 == 0) {
        pIVar1 = instr->m_next;
        IR::Instr::Remove(instr);
        return pIVar1;
      }
    }
  }
  pIStack_28 = instr;
  if ((instr->m_opcode == NOP) && (pOVar6 = IR::Instr::GetDst(instr), pOVar6 != (Opnd *)0x0)) {
    pOVar6 = IR::Instr::GetDst(instr);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar6);
    if (bVar3) {
      pOVar6 = IR::Instr::GetDst(instr);
      this_00 = IR::Opnd::AsRegOpnd(pOVar6);
      RVar4 = IR::RegOpnd::GetReg(this_00);
      if (RVar4 == RegArg2) {
        bVar3 = false;
        retInstr = instr;
        do {
          retInstr = IR::Instr::GetPrevRealInstrOrLabel(retInstr);
          if (retInstr->m_opcode == IMUL) {
LAB_0083b1c7:
            bVar3 = true;
            break;
          }
          if (retInstr->m_opcode == CALL) {
            this_01 = Func::GetJITFunctionBody(this->func);
            bVar5 = JITTimeFunctionBody::IsWasmFunction(this_01);
            if (bVar5) goto LAB_0083b1c7;
          }
          bVar5 = IR::Instr::StartsBasicBlock(retInstr);
        } while (((bVar5 ^ 0xffU) & 1) != 0);
        retInstr = instr;
        if (bVar3) {
          pIStack_28 = instr->m_next;
          IR::Instr::Remove(instr);
        }
        else {
          do {
            retInstr = IR::Instr::GetNextRealInstrOrLabel(retInstr);
            if (retInstr->m_opcode == DIV) {
              bVar3 = true;
              pIStack_28 = instr->m_next;
              IR::Instr::Remove(instr);
              break;
            }
            bVar5 = IR::Instr::EndsBasicBlock(retInstr);
            bVar3 = false;
          } while (((bVar5 ^ 0xffU) & 1) != 0);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x481,"(found)","edx = NOP without an IMUL or DIV");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
        }
      }
    }
  }
  return pIStack_28;
}

Assistant:

IR::Instr *
Peeps::PeepRedundant(IR::Instr *instr)
{
    IR::Instr *retInstr = instr;

    if (instr->m_opcode == Js::OpCode::ADD || instr->m_opcode == Js::OpCode::SUB || instr->m_opcode == Js::OpCode::OR)
    {
        Assert(instr->GetSrc1() && instr->GetSrc2());
        if( (instr->GetSrc2()->IsIntConstOpnd() && instr->GetSrc2()->AsIntConstOpnd()->GetValue() == 0))
        {
            // remove instruction
            retInstr = instr->m_next;
            instr->Remove();
            return retInstr;
        }
    }
#if _M_IX86
    RegNum edx = RegEDX;
#else
    RegNum edx = RegRDX;
#endif
    if (instr->m_opcode == Js::OpCode::NOP && instr->GetDst() != NULL
        && instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->GetReg() == edx)
    {
        // dummy def used for non-32bit ovf check for IMUL
        // check edx is not killed between IMUL and edx = NOP, then remove the NOP
        bool found = false;
        IR::Instr *nopInstr = instr;
        do
        {
            instr = instr->GetPrevRealInstrOrLabel();
            if (
                instr->m_opcode == Js::OpCode::IMUL ||
                (instr->m_opcode == Js::OpCode::CALL && this->func->GetJITFunctionBody()->IsWasmFunction())
            )
            {
                found = true;
                break;
            }
        } while(!instr->StartsBasicBlock());

        if (found)
        {
            retInstr = nopInstr->m_next;
            nopInstr->Remove();
        }
        else
        {
            instr = nopInstr;
            do
            {
                instr = instr->GetNextRealInstrOrLabel();
                if (instr->m_opcode == Js::OpCode::DIV)
                {
                    found = true;
                    retInstr = nopInstr->m_next;
                    nopInstr->Remove();
                    break;
                }
            } while (!instr->EndsBasicBlock());

            AssertMsg(found, "edx = NOP without an IMUL or DIV");
        }
    }
    return retInstr;
}